

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::NegativeDrawCase::iterate(NegativeDrawCase *this)

{
  ostringstream *this_00;
  uint uVar1;
  uint uVar2;
  deUint32 err;
  int iVar3;
  char *description;
  TestContext *this_01;
  GLuint vertexPosBuf;
  GLuint vaoId;
  Vec4 vertexPosData;
  uint local_1d8;
  uint local_1d4;
  Enum<int,_2UL> local_1d0;
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined1 local_1b0 [384];
  
  uVar1 = (*this->m_ctx->_vptr_Context[0x75])(this->m_ctx,this->m_program);
  uVar2 = (*this->m_ctx->_vptr_Context[0x59])(this->m_ctx,(ulong)uVar1,"a_position");
  local_1c0 = 0;
  uStack_1bc = 0;
  uStack_1b8 = 0;
  uStack_1b4 = 0x3f800000;
  local_1d4 = 0;
  local_1d8 = 0;
  (*this->m_ctx->_vptr_Context[0x4c])(this->m_ctx,1,&local_1d4);
  (*this->m_ctx->_vptr_Context[0x4b])(this->m_ctx,(ulong)local_1d4);
  (*this->m_ctx->_vptr_Context[0x26])(this->m_ctx,1,&local_1d8);
  (*this->m_ctx->_vptr_Context[0x25])(this->m_ctx,0x8892,(ulong)local_1d8);
  (*this->m_ctx->_vptr_Context[0x28])(this->m_ctx,0x8892,0x10,&local_1c0,0x88e4);
  (*this->m_ctx->_vptr_Context[0x4e])(this->m_ctx,(ulong)uVar2,4,0x1406,0,0,0);
  (*this->m_ctx->_vptr_Context[0x50])(this->m_ctx,(ulong)uVar2);
  (*this->m_ctx->_vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*this->m_ctx->_vptr_Context[0x2d])(this->m_ctx,0x4000);
  (*this->m_ctx->_vptr_Context[5])(this->m_ctx,0,0,1,1);
  (*this->m_ctx->_vptr_Context[0x76])(this->m_ctx,(ulong)uVar1);
  err = (*this->m_ctx->_vptr_Context[0x79])();
  glu::checkError(err,SSBOArrayLengthTests::init::arraysSized + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x984);
  (*this->m_ctx->_vptr_Context[0x68])(this->m_ctx,(ulong)this->m_inputPrimitives,0,1);
  iVar3 = (*this->m_ctx->_vptr_Context[0x79])();
  if (iVar3 != 0x502) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Expected GL_INVALID_OPERATION, got ",0x23);
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = iVar3;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Got wrong error code";
  }
  else {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
  }
  tcu::TestContext::setTestResult(this_01,(uint)(iVar3 != 0x502),description);
  (*this->m_ctx->_vptr_Context[0x76])(this->m_ctx,0);
  (*this->m_ctx->_vptr_Context[0x51])(this->m_ctx,(ulong)uVar2);
  (*this->m_ctx->_vptr_Context[0x27])(this->m_ctx,1,&local_1d8);
  (*this->m_ctx->_vptr_Context[0x4d])(this->m_ctx,1,&local_1d4);
  return STOP;
}

Assistant:

NegativeDrawCase::IterateResult NegativeDrawCase::iterate (void)
{
	const GLuint	programId		= m_ctx->createProgram(m_program);
	const GLint		attrPosLoc		= m_ctx->getAttribLocation(programId, "a_position");
	const tcu::Vec4 vertexPosData	(0, 0, 0, 1);

	GLuint vaoId		= 0;
	GLuint vertexPosBuf = 0;
	GLenum errorCode	= 0;

	m_ctx->genVertexArrays(1, &vaoId);
	m_ctx->bindVertexArray(vaoId);

	m_ctx->genBuffers(1, &vertexPosBuf);
	m_ctx->bindBuffer(GL_ARRAY_BUFFER, vertexPosBuf);
	m_ctx->bufferData(GL_ARRAY_BUFFER, sizeof(tcu::Vec4), vertexPosData.m_data, GL_STATIC_DRAW);
	m_ctx->vertexAttribPointer(attrPosLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	m_ctx->enableVertexAttribArray(attrPosLoc);

	m_ctx->clearColor(0, 0, 0, 1);
	m_ctx->clear(GL_COLOR_BUFFER_BIT);

	m_ctx->viewport(0, 0, 1, 1);

	m_ctx->useProgram(programId);

	// no errors before
	glu::checkError(m_ctx->getError(), "", __FILE__, __LINE__);

	m_ctx->drawArrays(m_inputPrimitives, 0, 1);

	errorCode = m_ctx->getError();
	if (errorCode != GL_INVALID_OPERATION)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Expected GL_INVALID_OPERATION, got " << glu::getErrorStr(errorCode) << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got wrong error code");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	m_ctx->useProgram(0);

	m_ctx->disableVertexAttribArray(attrPosLoc);
	m_ctx->deleteBuffers(1, &vertexPosBuf);

	m_ctx->deleteVertexArrays(1, &vaoId);

	return STOP;
}